

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O3

void Gia_ManStaticFanoutStart(Gia_Man_t *p)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  void *__s;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  
  if (p->vFanoutNums != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanoutNums == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xf4,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  if (p->vFanout != (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanout == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xf5,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
  }
  piVar2 = p->pRefs;
  p->pRefs = (int *)0x0;
  Gia_ManCreateRefs(p);
  piVar3 = p->pRefs;
  iVar9 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = iVar9;
  pVVar6->nCap = iVar9;
  pVVar6->pArray = piVar3;
  p->vFanoutNums = pVVar6;
  p->pRefs = piVar2;
  pVVar6 = Gia_ManStartFanoutMap(p,pVVar6);
  p->vFanout = pVVar6;
  uVar1 = p->nObjs;
  uVar11 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar11 = uVar1;
  }
  if ((uVar11 == 0) || (__s = malloc((long)(int)uVar11 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0,(long)(int)uVar1 << 2);
  }
  if (0 < (int)uVar1) {
    pGVar4 = p->pObjs;
    lVar7 = 0;
    lVar10 = 0;
    uVar8 = (ulong)uVar1;
    do {
      uVar11 = uVar1;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar14 = *(ulong *)(&pGVar4->field_0x0 + lVar7) & 0x1fffffff;
      iVar9 = (int)lVar10;
      if (uVar14 != 0x1fffffff) {
        iVar5 = (int)uVar14;
        pGVar13 = (Gia_Obj_t *)(lVar7 + (ulong)(uint)(iVar5 * 4) * -3 + (long)pGVar4);
        if ((pGVar13 < pGVar4) || (pGVar4 + uVar8 <= pGVar13)) goto LAB_00208e42;
        uVar11 = (int)((long)(lVar7 + (ulong)(uint)(iVar5 << 2) * -3) >> 2) * -0x55555555;
        if ((uVar1 <= uVar11) || (pVVar6->nSize <= (int)uVar11)) goto LAB_00208e23;
        uVar8 = (ulong)(uVar11 & 0x7fffffff);
        uVar11 = pVVar6->pArray[uVar8] + *(int *)((long)__s + uVar8 * 4);
        if (((int)uVar11 < 0) || ((uint)pVVar6->nSize <= uVar11)) goto LAB_00208e61;
        pVVar6->pArray[uVar11] = iVar9;
        if (pGVar4 + p->nObjs <= pGVar13) goto LAB_00208e42;
        piVar2 = (int *)((long)__s + uVar8 * 4);
        *piVar2 = *piVar2 + 1;
        uVar11 = (uint)*(undefined8 *)(&pGVar4->field_0x0 + lVar7);
        if ((-1 < (int)uVar11 && (~uVar11 & 0x1fffffff) != 0) &&
           (uVar12 = (uint)((ulong)*(undefined8 *)(&pGVar4->field_0x0 + lVar7) >> 0x20),
           (uVar11 & 0x1fffffff) == 0x1fffffff || (uVar11 & 0x1fffffff) != (uVar12 & 0x1fffffff))) {
          uVar12 = uVar12 & 0x1fffffff;
          pGVar13 = (Gia_Obj_t *)(lVar7 + (ulong)(uVar12 * 4) * -3 + (long)pGVar4);
          if ((pGVar13 < pGVar4) || (pGVar4 + p->nObjs <= pGVar13)) goto LAB_00208e42;
          uVar11 = (int)((long)(lVar7 + (ulong)(uVar12 << 2) * -3) >> 2) * -0x55555555;
          if ((((int)uVar11 < 0) || (uVar1 <= uVar11)) || (pVVar6->nSize <= (int)uVar11))
          goto LAB_00208e23;
          if (p->nObjs <= lVar10) goto LAB_00208e42;
          uVar8 = (ulong)(uVar11 & 0x7fffffff);
          uVar11 = pVVar6->pArray[uVar8] + *(int *)((long)__s + uVar8 * 4);
          if (((int)uVar11 < 0) || ((uint)pVVar6->nSize <= uVar11)) goto LAB_00208e61;
          pVVar6->pArray[uVar11] = iVar9;
          if (pGVar4 + p->nObjs <= pGVar13) goto LAB_00208e42;
          piVar2 = (int *)((long)__s + uVar8 * 4);
          *piVar2 = *piVar2 + 1;
        }
      }
      uVar11 = p->nObjs;
      uVar8 = (ulong)uVar11;
      uVar14 = (ulong)(int)uVar11;
      if ((long)uVar14 <= lVar10) {
LAB_00208e42:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      if ((p->pMuxes != (uint *)0x0) && (uVar12 = p->pMuxes[lVar10], uVar12 != 0)) {
        if ((int)uVar12 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar12 = uVar12 >> 1;
        uVar14 = (ulong)uVar12;
        if ((int)uVar11 <= (int)uVar12) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (((int)uVar1 <= (int)uVar12) || (pVVar6->nSize <= (int)uVar12)) goto LAB_00208e23;
        uVar11 = pVVar6->pArray[uVar14] + *(int *)((long)__s + uVar14 * 4);
        if (((int)uVar11 < 0) || ((uint)pVVar6->nSize <= uVar11)) {
LAB_00208e61:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar6->pArray[uVar11] = iVar9;
        uVar8 = (ulong)(uint)p->nObjs;
        if (p->nObjs <= (int)uVar12) goto LAB_00208e42;
        piVar2 = (int *)((long)__s + uVar14 * 4);
        *piVar2 = *piVar2 + 1;
        uVar14 = uVar8;
      }
      uVar11 = (uint)uVar8;
      lVar10 = lVar10 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar10 < (long)uVar14);
    if ((0 < (int)uVar11) && (p->pObjs != (Gia_Obj_t *)0x0)) {
      uVar8 = 0;
      do {
        if ((uVar1 == uVar8) || ((long)p->vFanoutNums->nSize <= (long)uVar8)) {
LAB_00208e23:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)((long)__s + uVar8 * 4) != p->vFanoutNums->pArray[uVar8]) {
          __assert_fail("Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                        ,0x11a,"void Gia_ManStaticFanoutStart(Gia_Man_t *)");
        }
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
      goto LAB_00208dfe;
    }
  }
  if (__s == (void *)0x0) {
    return;
  }
LAB_00208dfe:
  free(__s);
  return;
}

Assistant:

void Gia_ManStaticFanoutStart( Gia_Man_t * p )
{
    Vec_Int_t * vCounts;
    int * pRefsOld;
    Gia_Obj_t * pObj, * pFanin;
    int i, iFanout;
    assert( p->vFanoutNums == NULL );
    assert( p->vFanout == NULL );
    // recompute reference counters
    pRefsOld = p->pRefs; p->pRefs = NULL;
    Gia_ManCreateRefs(p);
    p->vFanoutNums = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) );
    p->pRefs = pRefsOld;
    // start the fanout maps
    p->vFanout = Gia_ManStartFanoutMap( p, p->vFanoutNums );
    // incrementally add fanouts
    vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pFanin = Gia_ObjFanin0(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsBuf(pObj) )
        {
            pFanin = Gia_ObjFanin1(pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
        if ( Gia_ObjIsMux(p, pObj) )
        {

            pFanin = Gia_ObjFanin2(p, pObj);
            iFanout = Vec_IntEntry( vCounts, Gia_ObjId(p, pFanin) );
            Gia_ObjSetFanout( p, pFanin, iFanout, pObj );
            Vec_IntAddToEntry( vCounts, Gia_ObjId(p, pFanin), 1 );
        }
    }
    // double-check the current number of fanouts added
    Gia_ManForEachObj( p, pObj, i )
        assert( Vec_IntEntry(vCounts, i) == Gia_ObjFanoutNum(p, pObj) );
    Vec_IntFree( vCounts );
}